

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# about_impl.cpp
# Opt level: O0

void __thiscall ui::AboutImpl::AboutImpl(AboutImpl *this)

{
  Ref<ftxui::ButtonOption> option;
  shared_ptr<ftxui::ComponentBase> local_a8;
  undefined1 local_91;
  Ref<ftxui::ButtonOption> local_90;
  anon_class_8_1_8991fb9c local_80;
  function<void_()> local_78;
  ConstStringRef local_58;
  ConstStringRef local_30;
  AboutImpl *this_local;
  
  local_30.address_ = (string *)this;
  PanelBase::PanelBase(&this->super_PanelBase);
  (this->super_PanelBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__AboutImpl_00218718;
  std::__cxx11::string::string((string *)&this->title_);
  this->view_logo = false;
  std::__cxx11::string::string((string *)&this->button_text);
  ftxui::ButtonOption::ButtonOption(&this->opt);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr(&this->viewLogo);
  (this->opt).border = false;
  std::__cxx11::string::operator=((string *)&this->button_text,"View Logo");
  ftxui::ConstStringRef::ConstStringRef(&local_58,&this->button_text);
  local_80.this = this;
  std::function<void()>::function<ui::AboutImpl::AboutImpl()::_lambda()_1_,void>
            ((function<void()> *)&local_78,&local_80);
  local_91 = (this->opt).border;
  ftxui::Ref<ftxui::ButtonOption>::Ref(&local_90,local_91);
  option.address_._0_1_ = local_90.owned_.border;
  option.address_._1_3_ = local_90._1_3_;
  option._0_8_ = &local_78;
  option.address_._4_4_ = 0;
  ftxui::Button(&local_30,(function<void_()> *)&local_58,option);
  std::shared_ptr<ftxui::ComponentBase>::operator=
            (&this->viewLogo,(shared_ptr<ftxui::ComponentBase> *)&local_30);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr((shared_ptr<ftxui::ComponentBase> *)&local_30);
  std::function<void_()>::~function(&local_78);
  ftxui::ConstStringRef::~ConstStringRef(&local_58);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr(&local_a8,&this->viewLogo);
  ftxui::ComponentBase::Add((ComponentBase *)this,&local_a8);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&local_a8);
  return;
}

Assistant:

AboutImpl() {
    opt.border = false;
    button_text = "View Logo";
    viewLogo = Button(
        &button_text,
        [&] {
          view_logo = !view_logo;
          if (view_logo) {
            button_text = "Go Back";
          } else {
            button_text = "View Logo";
          }
        },
        opt);
    Add(viewLogo);
  }